

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_filesystem_joinPath(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  void *__dest;
  uint uVar1;
  void *__src;
  ulong __n;
  bool bVar2;
  
  bVar2 = (right & 0xf) != 0;
  if (((((bVar2 || right == 0) || ((*(uint *)(right + 8) & 0x300) != 0x200)) ||
       (*(int *)(right + 0xc) == 0)) || (*(char *)(right + 0x10) != '/')) &&
     ((((left & 0xf) == 0 && left != 0 &&
       ((!bVar2 && right != 0) && (*(uint *)(left + 8) & 0x300) == 0x200)) &&
      ((*(uint *)(right + 8) & 0x300) == 0x200)))) {
    __n = (ulong)*(uint *)(left + 0xc);
    uVar1 = *(uint *)(right + 0xc);
    if (__n == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = *(char *)(left + 0xf + __n) == '/';
    }
    __src = (void *)(right + 0x10);
    right = sysbvm_string_createEmptyWithSize(context,(ulong)(bVar2 ^ 1) + (ulong)uVar1 + __n);
    __dest = (void *)(right + 0x10);
    memcpy(__dest,(void *)(left + 0x10),__n);
    if (bVar2 == false) {
      *(undefined1 *)((long)__dest + __n) = 0x2f;
      __n = __n + 1;
    }
    memcpy((void *)((long)__dest + __n),__src,(ulong)uVar1);
  }
  return right;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_joinPath(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_filesystem_isAbsolute(right) || !sysbvm_tuple_isBytes(left) || !sysbvm_tuple_isBytes(right))
        return right;

    size_t leftSize = sysbvm_tuple_getSizeInBytes(left);
    uint8_t *leftBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(left)->bytes;

    size_t rightSize = sysbvm_tuple_getSizeInBytes(right);
    uint8_t *rightBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(right)->bytes;

    bool hasSeparator = false;
    if(leftSize > 0)
    {
        uint8_t lastCharacter = leftBytes[leftSize - 1];
#ifdef _WIN32
        hasSeparator = lastCharacter == '/' || lastCharacter == '\\';
#else
        hasSeparator = lastCharacter == '/';
#endif
    }

    size_t resultSize = leftSize + (hasSeparator ? 0 : 1) + rightSize;
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, resultSize);

    size_t destIndex = 0;
    uint8_t *destBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;

    memcpy(destBytes, leftBytes, leftSize);
    destIndex += leftSize;

    if(!hasSeparator)
        destBytes[destIndex++] = '/';

    memcpy(destBytes + destIndex, rightBytes, rightSize);
    return result;
}